

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_timeout.cpp
# Opt level: O3

void __thiscall tst_qpromise_timeout::timeout(tst_qpromise_timeout *this)

{
  long *plVar1;
  QSharedData *pQVar2;
  anon_class_24_3_494f60a1 callback;
  long *plVar3;
  undefined8 uVar4;
  PromiseResolver<int> PVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar6;
  PromiseResolver<void> PVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  long *plVar11;
  QSlotObjectBase *pQVar12;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseData<int> *pPVar13;
  PromiseDataBase<int,_void_(const_int_&)> *this_01;
  char *pcVar14;
  char *pcVar15;
  QPromiseReject<int> *in_R8;
  QSharedData *pQVar16;
  QSharedData *pQVar17;
  bool failed;
  function<void_(const_int_&)> local_198;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_178;
  PromiseResolver<int> resolver_3;
  PromiseResolver<int> resolver;
  QPromiseBase<int> local_138;
  bool *local_128;
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_110;
  PromiseResolver<int> resolver_2;
  PromiseResolver<void> resolver_1;
  qint64 elapsed;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _func_int **local_68;
  QElapsedTimer timer;
  _Any_data local_50;
  code *local_40;
  
  timer.t1 = -0x8000000000000000;
  timer.t2 = -0x8000000000000000;
  elapsed = -1;
  failed = false;
  QElapsedTimer::start();
  plVar11 = (long *)operator_new(0x68);
  *plVar11 = 0;
  plVar11[1] = 0;
  plVar11[2] = 0;
  plVar11[3] = 0;
  plVar11[4] = 0;
  plVar11[5] = 0;
  plVar11[6] = 0;
  plVar11[7] = 0;
  plVar11[8] = 0;
  plVar11[9] = 0;
  plVar11[10] = 0;
  plVar11[0xb] = 0;
  plVar11[0xc] = 0;
  *plVar11 = (long)&PTR__PromiseDataBase_0011eb88;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(plVar11 + 2),0);
  *(undefined1 *)(plVar11 + 3) = 0;
  plVar11[4] = 0;
  plVar11[5] = 0;
  plVar11[6] = 0;
  plVar11[7] = 0;
  plVar11[8] = 0;
  plVar11[9] = 0;
  plVar11[10] = 0;
  local_68 = (_func_int **)&PTR__PromiseData_0011eb10;
  *plVar11 = (long)&PTR__PromiseData_0011eb10;
  plVar11[0xb] = 0;
  plVar11[0xc] = 0;
  LOCK();
  *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
  UNLOCK();
  LOCK();
  *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
  UNLOCK();
  plVar3 = plVar11 + 1;
  local_198.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011ead8;
  local_198.super__Function_base._M_functor._8_8_ = plVar11;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_198);
  local_198.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0011eaa8;
  if ((long *)local_198.super__Function_base._M_functor._8_8_ != (long *)0x0) {
    LOCK();
    plVar1 = (long *)(local_198.super__Function_base._M_functor._8_8_ + 8);
    *(int *)plVar1 = *(int *)plVar1 + -1;
    UNLOCK();
    if ((*(int *)plVar1 == 0) &&
       ((long *)local_198.super__Function_base._M_functor._8_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_198.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar5.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  pQVar12 = (QSlotObjectBase *)operator_new(0x18);
  if (PVar5.m_d.d == (Data *)0x0) {
    (pQVar12->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar12->m_impl =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:84:43),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(undefined8 *)(pQVar12 + 1) = 0;
  }
  else {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
    UNLOCK();
    (pQVar12->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar12->m_impl =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp:84:43),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)(pQVar12 + 1) =
         PVar5.m_d.d;
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + 1;
    UNLOCK();
  }
  QTimer::singleShotImpl(4000,CoarseTimer,(QObject *)0x0,pQVar12);
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  local_198.super__Function_base._M_functor._8_8_ = &local_110;
  local_110.d = (Data *)&PTR__QException_0011ea58;
  local_198.super__Function_base._M_functor._M_unused._M_object = &resolver_1;
  resolver_1.m_d.d._0_4_ = 2000;
  LOCK();
  *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
  UNLOCK();
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011ead8;
  callback.error = (QPromiseTimeoutException *)local_198.super__Function_base._M_functor._8_8_;
  callback.msec = (int *)local_198.super__Function_base._M_functor._M_unused._0_8_;
  callback.p = (QPromise<int> *)&resolver;
  local_198.super__Function_base._M_manager = (_Manager_type)&resolver;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:122:24),_0>
            (&local_138,callback);
  local_138._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ead8;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011eaa8;
  if (plVar11 != (long *)0x0) {
    LOCK();
    plVar1 = plVar11 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if (((int)*plVar1 == 0) && (plVar11 != (long *)0x0)) {
      (**(code **)(*plVar11 + 8))();
    }
  }
  QVar6.d = local_138.m_d.d;
  if (local_138.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar17 = &((local_138.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData
    ;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ecf8;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011ec90;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar17 = &this_00->super_QSharedData;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011ec28;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011ec70;
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar2 = &this_00->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (this_00 != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (*this_00->_vptr_PromiseDataBase[1])();
    }
  }
  PVar7.m_d.d = resolver_1.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_198.super__Function_base._M_functor._M_unused._M_object = (Data *)0x0;
LAB_001061cd:
    local_198.super__Function_base._M_functor._8_8_ = (Data *)0x0;
    bVar8 = true;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_198.super__Function_base._M_functor._M_unused._M_object = (void *)resolver_1.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_001061cd;
    }
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_198.super__Function_base._M_functor._M_unused._M_object = (void *)resolver_1.m_d.d;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_198.super__Function_base._M_functor._8_8_ = resolver_1.m_d.d;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    bVar8 = false;
  }
  uVar4 = local_198.super__Function_base._M_functor._8_8_;
  local_198._M_invoker = (_Invoker_type)&timer;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_198.super__Function_base._M_manager = (_Manager_type)&elapsed;
  local_88._M_unused._M_object = operator_new(0x20);
  *(void **)local_88._M_unused._0_8_ = local_198.super__Function_base._M_functor._M_unused._M_object
  ;
  if ((Data *)local_198.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._M_unused._0_8_ =
         *local_198.super__Function_base._M_functor._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) =
       local_198.super__Function_base._M_functor._8_8_;
  if ((Data *)local_198.super__Function_base._M_functor._8_8_ == (Data *)0x0) {
    *(_Manager_type *)((long)local_88._M_unused._0_8_ + 0x10) =
         local_198.super__Function_base._M_manager;
    *(_Invoker_type *)((long)local_88._M_unused._0_8_ + 0x18) = local_198._M_invoker;
    pcStack_70 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._8_8_ =
         *(int *)local_198.super__Function_base._M_functor._8_8_ + 1;
    UNLOCK();
    *(_Manager_type *)((long)local_88._M_unused._0_8_ + 0x10) =
         local_198.super__Function_base._M_manager;
    *(_Invoker_type *)((long)local_88._M_unused._0_8_ + 0x18) = local_198._M_invoker;
    pcStack_70 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    if ((Data *)local_198.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_198.super__Function_base._M_functor._8_8_ =
           *(int *)local_198.super__Function_base._M_functor._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_198.super__Function_base._M_functor._8_8_ == 0) {
        operator_delete((void *)local_198.super__Function_base._M_functor._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_198.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._M_unused._0_8_ =
         *local_198.super__Function_base._M_functor._M_unused._M_object + -1;
    UNLOCK();
    if (*local_198.super__Function_base._M_functor._M_unused._M_object == 0) {
      operator_delete(local_198.super__Function_base._M_functor._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  local_198.super__Function_base._M_functor._M_unused._M_object = (void *)PVar7.m_d.d;
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + 1;
    UNLOCK();
  }
  if (!bVar8) {
    LOCK();
    *(int *)uVar4 = *(int *)uVar4 + 1;
    UNLOCK();
  }
  local_198._M_invoker = (_Invoker_type)&timer;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_198.super__Function_base._M_functor._8_8_ = uVar4;
  local_198.super__Function_base._M_manager = (_Manager_type)&elapsed;
  local_a8._M_unused._M_object = operator_new(0x20);
  *(void **)local_a8._M_unused._0_8_ = local_198.super__Function_base._M_functor._M_unused._M_object
  ;
  if ((Data *)local_198.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._M_unused._0_8_ =
         *local_198.super__Function_base._M_functor._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) =
       local_198.super__Function_base._M_functor._8_8_;
  if ((Data *)local_198.super__Function_base._M_functor._8_8_ == (Data *)0x0) {
    *(_Manager_type *)((long)local_a8._M_unused._0_8_ + 0x10) =
         local_198.super__Function_base._M_manager;
    *(_Invoker_type *)((long)local_a8._M_unused._0_8_ + 0x18) = local_198._M_invoker;
    pcStack_90 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._8_8_ =
         *(int *)local_198.super__Function_base._M_functor._8_8_ + 1;
    UNLOCK();
    *(_Manager_type *)((long)local_a8._M_unused._0_8_ + 0x10) =
         local_198.super__Function_base._M_manager;
    *(_Invoker_type *)((long)local_a8._M_unused._0_8_ + 0x18) = local_198._M_invoker;
    pcStack_90 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    if ((Data *)local_198.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_198.super__Function_base._M_functor._8_8_ =
           *(int *)local_198.super__Function_base._M_functor._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_198.super__Function_base._M_functor._8_8_ == 0) {
        operator_delete((void *)local_198.super__Function_base._M_functor._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_198.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._M_unused._0_8_ =
         *local_198.super__Function_base._M_functor._M_unused._M_object + -1;
    UNLOCK();
    if (*local_198.super__Function_base._M_functor._M_unused._M_object == 0) {
      operator_delete(local_198.super__Function_base._M_functor._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (!bVar8) {
    LOCK();
    *(int *)uVar4 = *(int *)uVar4 + -1;
    UNLOCK();
    if (*(int *)uVar4 == 0) {
      operator_delete((void *)uVar4,0x10);
    }
  }
  if (PVar7.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar7.m_d.d = *(int *)PVar7.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar7.m_d.d == 0) {
      operator_delete((void *)PVar7.m_d.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  pQVar16 = &((QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar2 = &((QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011eaa8;
  pPVar13 = (PromiseData<int> *)operator_new(0x68);
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_0011eb88;
  QReadWriteLock::QReadWriteLock
            (&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_68;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar13 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011ead8;
  p.super_QPromiseBase<int>.m_d.d = pPVar13;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,(QPromise<int> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011eaa8;
  if (pPVar13 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (pPVar13 != (PromiseData<int> *)0x0)) {
      (*(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_2.m_d.d == (Data *)0x0) {
    resolver_3.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
    local_178.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    resolver_3 = resolver_2;
    if (resolver_2.m_d.d == (Data *)0x0) {
      local_178.d = (Data *)0x0;
LAB_00106600:
      LOCK();
      *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
      UNLOCK();
      if (local_178.d == (Data *)0x0) goto LAB_00106615;
    }
    else {
      LOCK();
      *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
      UNLOCK();
      local_178 = resolver_2.m_d.d;
      if (resolver_2.m_d.d != (Data *)0x0) goto LAB_00106600;
    }
    LOCK();
    ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_00106615:
  local_198._M_invoker = (_Invoker_type)QVar6.d;
  LOCK();
  pQVar2 = &((QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_198.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_0011ead8;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  local_198.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)resolver_3.m_d.d;
  local_198.super__Function_base._M_functor._8_8_ = local_178.d;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x20);
  *(void **)resolver_1.m_d.d = local_198.super__Function_base._M_functor._M_unused._M_object;
  if ((Data *)local_198.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._M_unused._0_8_ =
         *local_198.super__Function_base._M_functor._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver_1.m_d.d)->promise =
       (QPromise<void> *)local_198.super__Function_base._M_functor._8_8_;
  if ((Data *)local_198.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._8_8_ =
         *(int *)local_198.super__Function_base._M_functor._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver_1.m_d.d + 0x10) = &PTR__QPromiseBase_0011eaa8;
  ((Data *)((long)resolver_1.m_d.d + 0x10))->promise = (QPromise<void> *)local_198._M_invoker;
  if ((PromiseData<int> *)local_198._M_invoker == (PromiseData<int> *)0x0) {
    *(undefined ***)((long)resolver_1.m_d.d + 0x10) = &PTR__QPromiseBase_0011ead8;
    local_198.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_0011eaa8;
  }
  else {
    LOCK();
    pQVar2 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_198._M_invoker)->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(undefined ***)((long)resolver_1.m_d.d + 0x10) = &PTR__QPromiseBase_0011ead8;
    local_198.super__Function_base._M_manager = (_Manager_type)&PTR__QPromiseBase_0011eaa8;
    if ((PromiseData<int> *)local_198._M_invoker != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar2 = &((PromiseDataBase<int,_void_(const_int_&)> *)local_198._M_invoker)->
                super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) &&
         ((PromiseData<int> *)local_198._M_invoker != (PromiseData<int> *)0x0)) {
        (*((PromiseDataBase<int,_void_(const_int_&)> *)local_198._M_invoker)->_vptr_PromiseDataBase
          [1])();
      }
    }
  }
  if ((Data *)local_198.super__Function_base._M_functor._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._8_8_ =
         *(int *)local_198.super__Function_base._M_functor._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_198.super__Function_base._M_functor._8_8_ == 0) {
      operator_delete((void *)local_198.super__Function_base._M_functor._8_8_,0x10);
    }
  }
  if ((Data *)local_198.super__Function_base._M_functor._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_198.super__Function_base._M_functor._M_unused._0_8_ =
         *local_198.super__Function_base._M_functor._M_unused._M_object + -1;
    UNLOCK();
    if (*local_198.super__Function_base._M_functor._M_unused._M_object == 0) {
      operator_delete(local_198.super__Function_base._M_functor._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_00,(function<void_()> *)&resolver_1);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
  ::_M_manager((_Any_data *)&resolver_1,(_Any_data *)&resolver_1,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&resolver_3,
             (QPromiseResolve<int> *)&local_178,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_178.d != (Data *)0x0) {
    LOCK();
    ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_178.d,0x10);
    }
  }
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_3.m_d.d == 0) {
      operator_delete((void *)resolver_3.m_d.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ead8;
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_00);
  }
  LOCK();
  (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
  }
  LOCK();
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar16->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
  }
  local_138._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011eaa8;
  if (local_138.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar17 = &((local_138.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData
    ;
    (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_138.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_138.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1]
      )();
    }
  }
  QException::~QException((QException *)&local_110);
  LOCK();
  *(int *)plVar3 = (int)*plVar3 + -1;
  UNLOCK();
  if ((int)*plVar3 == 0) {
    (**(code **)(*plVar11 + 8))(plVar11);
  }
  this_01 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0011eb88;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = local_68;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar17 = &this_01->super_QSharedData;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011ead8;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_3,(QPromise<int> *)&resolver_2);
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_0011eaa8;
  if (this_01 != (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar2 = &this_01->super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (this_01 != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (*this_01->_vptr_PromiseDataBase[1])();
    }
  }
  QVar6.d = p.super_QPromiseBase<int>.m_d.d;
  if (resolver_3.m_d.d == (Data *)0x0) {
    local_178.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    local_178 = resolver_3.m_d.d;
    if (resolver_3.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
      UNLOCK();
      local_110 = resolver_3.m_d.d;
      goto LAB_001069bc;
    }
  }
  local_110.d = (Data *)0x0;
LAB_001069bc:
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            (&local_198,(PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_178,
             (QPromiseResolve<int> *)&local_110,in_R8);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_198);
  if ((undefined **)local_198.super__Function_base._M_manager != (undefined **)0x0) {
    (*local_198.super__Function_base._M_manager)
              ((_Any_data *)&local_198,(_Any_data *)&local_198,__destroy_functor);
  }
  local_138._vptr_QPromiseBase = (_func_int **)local_178.d;
  if (local_178.d != (Data *)0x0) {
    LOCK();
    ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_138.m_d.d = (PromiseData<int> *)local_110.d;
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128 = &failed;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       operator_new(0x18);
  *(_func_int ***)resolver.m_d.d = local_138._vptr_QPromiseBase;
  if ((Data *)local_138._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_138._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_138._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)local_138.m_d.d;
  if (local_138.m_d.d == (PromiseData<int> *)0x0) {
    *(bool **)((long)resolver.m_d.d + 0x10) = local_128;
  }
  else {
    LOCK();
    (((QAtomicInt *)
     &((local_138.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
    super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QAtomicInt *)
            &((local_138.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
             _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(bool **)((long)resolver.m_d.d + 0x10) = local_128;
    if (local_138.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      (((QAtomicInt *)
       &((local_138.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
      super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((QAtomicInt *)
              &((local_138.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
               _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
             _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QAtomicInt *)
           &((local_138.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
            _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(local_138.m_d.d,0x10);
      }
    }
  }
  if ((Data *)local_138._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_138._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_138._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QSharedData *)local_138._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_138._vptr_QPromiseBase,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  std::
  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  if (local_110.d != (Data *)0x0) {
    LOCK();
    ((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)
        *(__int_type *)
         &((local_110.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
      operator_delete(local_110.d,0x10);
    }
  }
  if (local_178.d != (Data *)0x0) {
    LOCK();
    ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_178.d,0x10);
    }
  }
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_3.m_d.d == 0) {
      operator_delete((void *)resolver_3.m_d.d,0x10);
    }
  }
  QVar6.d = p.super_QPromiseBase<int>.m_d.d;
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
  while (bVar8 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
  }
  LOCK();
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  iVar10 = waitForValue<int>(&p,(int *)0xffffffff);
  cVar9 = QTest::qCompare(iVar10,-1,"waitForValue(p, -1)","-1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                          ,0x61);
  QVar6 = p.super_QPromiseBase<int>.m_d;
  if (cVar9 == '\0') {
    if (p.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
      return;
    }
  }
  else {
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    bVar8 = (bool)(~bVar8 & ((QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.
                            m_data._M_exception_object != (void *)0x0);
    local_138._vptr_QPromiseBase = (_func_int **)CONCAT71(local_138._vptr_QPromiseBase._1_7_,bVar8);
    resolver_2.m_d.d._0_1_ = 1;
    pcVar14 = QTest::toString<bool>((bool *)&local_138);
    pcVar15 = QTest::toString<bool>((bool *)&resolver_2);
    cVar9 = QTest::compare_helper
                      (bVar8,"Compared values are not the same",pcVar14,pcVar15,"p.isRejected()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                       ,0x62);
    bVar8 = failed;
    if (cVar9 != '\0') {
      local_138._vptr_QPromiseBase = (_func_int **)CONCAT71(local_138._vptr_QPromiseBase._1_7_,1);
      pcVar14 = QTest::toString<bool>(&failed);
      pcVar15 = QTest::toString<bool>((bool *)&local_138);
      cVar9 = QTest::compare_helper
                        (bVar8,"Compared values are not the same",pcVar14,pcVar15,"failed","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                         ,99);
      if ((cVar9 != '\0') &&
         (cVar9 = QTest::qVerify(0x757 < elapsed,"elapsed >= static_cast<qint64>(2000 * 0.94)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                                 ,0x68), cVar9 != '\0')) {
        QTest::qVerify(elapsed < 0x849,"elapsed <= static_cast<qint64>(2000 * 1.06)","",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_timeout.cpp"
                       ,0x69);
      }
    }
  }
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011eaa8;
  LOCK();
  pQVar17 = &((QVar6.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if (((pQVar17->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i == 0) &&
     (p.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
    (*((p.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
      _vptr_PromiseDataBase[1])();
  }
  return;
}

Assistant:

void tst_qpromise_timeout::timeout()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;
    bool failed = false;

    timer.start();

    auto p = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
                 QTimer::singleShot(4000, [=]() {
                     resolve(42);
                 });
             }}.timeout(2000)
                 .finally([&]() {
                     elapsed = timer.elapsed();
                 });

    p.fail([&](const QtPromise::QPromiseTimeoutException&) {
         failed = true;
         return -1;
     }).wait();

    QCOMPARE(waitForValue(p, -1), -1);
    QCOMPARE(p.isRejected(), true);
    QCOMPARE(failed, true);

    // Qt::CoarseTimer (default) Coarse timers try to
    // keep accuracy within 5% of the desired interval.
    // Require accuracy within 6% for passing the test.
    QVERIFY(elapsed >= static_cast<qint64>(2000 * 0.94));
    QVERIFY(elapsed <= static_cast<qint64>(2000 * 1.06));
}